

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O0

CATNNode<char> * __thiscall
Centaurus::CompositeATN<char>::get_node(CompositeATN<char> *this,Identifier *id,int index)

{
  mapped_type *this_00;
  CATNNode<char> *pCVar1;
  int index_local;
  Identifier *id_local;
  CompositeATN<char> *this_local;
  
  this_00 = std::
            unordered_map<Centaurus::Identifier,_Centaurus::CATNMachine<char>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<char>_>_>_>
            ::at(&this->m_dict,id);
  pCVar1 = CATNMachine<char>::operator[](this_00,index);
  return pCVar1;
}

Assistant:

const CATNNode<TCHAR>& get_node(const Identifier& id, int index) const
    {
        return m_dict.at(id)[index];
    }